

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O1

void __thiscall rlottie::internal::renderer::CompLayer::preprocessStage(CompLayer *this,VRect *clip)

{
  Clipper *this_00;
  pointer ppLVar1;
  Layer *pLVar2;
  Layer *this_01;
  Layer *pLVar3;
  pointer ppLVar4;
  
  this_00 = (this->mClipper)._M_t.
            super___uniq_ptr_impl<rlottie::internal::renderer::Clipper,_std::default_delete<rlottie::internal::renderer::Clipper>_>
            ._M_t.
            super__Tuple_impl<0UL,_rlottie::internal::renderer::Clipper_*,_std::default_delete<rlottie::internal::renderer::Clipper>_>
            .super__Head_base<0UL,_rlottie::internal::renderer::Clipper_*,_false>._M_head_impl;
  if (this_00 != (Clipper *)0x0) {
    Clipper::preprocess(this_00,clip);
  }
  ppLVar4 = (this->mLayers).
            super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppLVar1 = (this->mLayers).
            super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppLVar4 != ppLVar1) {
    pLVar3 = (Layer *)0x0;
    do {
      this_01 = *ppLVar4;
      pLVar2 = this_01->mLayerData;
      if (pLVar2->mMatteType == None) {
        if ((pLVar2->mInFrame <= this_01->mFrameNo) && (this_01->mFrameNo <= pLVar2->mOutFrame)) {
          if (pLVar3 != (Layer *)0x0) {
            if ((pLVar3->mFrameNo < pLVar3->mLayerData->mInFrame) ||
               (pLVar3->mLayerData->mOutFrame < pLVar3->mFrameNo)) goto LAB_0012904a;
            Layer::preprocess(this_01,clip);
            this_01 = pLVar3;
          }
          Layer::preprocess(this_01,clip);
        }
LAB_0012904a:
        this_01 = (Layer *)0x0;
      }
      ppLVar4 = ppLVar4 + 1;
      pLVar3 = this_01;
    } while (ppLVar4 != ppLVar1);
  }
  return;
}

Assistant:

void renderer::CompLayer::preprocessStage(const VRect &clip)
{
    // if layer has clipper
    if (mClipper) mClipper->preprocess(clip);

    renderer::Layer *matte = nullptr;
    for (const auto &layer : mLayers) {
        if (layer->hasMatte()) {
            matte = layer;
        } else {
            if (layer->visible()) {
                if (matte) {
                    if (matte->visible()) {
                        layer->preprocess(clip);
                        matte->preprocess(clip);
                    }
                } else {
                    layer->preprocess(clip);
                }
            }
            matte = nullptr;
        }
    }
}